

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O2

void xercesc_4_0::XMLString::sizeToText
               (XMLSize_t toFormat,char *toFill,XMLSize_t maxChars,uint radix,MemoryManager *manager
               )

{
  char *pcVar1;
  RuntimeException *this;
  ulong uVar2;
  ulong uVar3;
  pointer_____offset_0x10___ *ppuVar4;
  undefined8 uStack_a0;
  char tmpBuf [128];
  
  if (maxChars == 0) {
    uStack_a0 = 0x265fd6;
    this = (RuntimeException *)__cxa_allocate_exception(0x30);
    uStack_a0 = 0x265ff1;
    IllegalArgumentException::IllegalArgumentException
              ((IllegalArgumentException *)this,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLString.cpp"
               ,0x61,Str_ZeroSizedTargetBuf,manager);
  }
  else {
    if (toFormat == 0) {
      toFill[0] = '0';
      toFill[1] = '\0';
      return;
    }
    if (radix == 2) {
      uVar2 = 0;
      for (; toFormat != 0; toFormat = toFormat >> 1) {
        tmpBuf[uVar2] = (byte)toFormat & 1 | 0x30;
        uVar2 = uVar2 + 1;
      }
    }
    else if (radix == 0x10) {
      uVar2 = 0;
      for (; toFormat != 0; toFormat = toFormat >> 4) {
        tmpBuf[uVar2] = "0123456789ABCDEF"[(uint)toFormat & 0xf];
        uVar2 = uVar2 + 1;
      }
    }
    else {
      if ((radix & 0xfffffffd) != 8) {
        uStack_a0 = 0x266036;
        this = (RuntimeException *)__cxa_allocate_exception(0x30);
        uStack_a0 = 0x266053;
        RuntimeException::RuntimeException
                  (this,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLString.cpp"
                   ,0x9c,Str_UnknownRadix,manager);
        ppuVar4 = &RuntimeException::typeinfo;
        goto LAB_0026601f;
      }
      uVar2 = 0;
      for (; toFormat != 0; toFormat = toFormat / radix) {
        tmpBuf[uVar2] = "0123456789ABCDEF"[toFormat % (ulong)radix];
        uVar2 = uVar2 + 1;
      }
    }
    pcVar1 = toFill;
    uVar3 = uVar2;
    if (uVar2 <= maxChars) {
      while (uVar3 != 0) {
        *pcVar1 = tmpBuf[uVar3 - 1];
        pcVar1 = pcVar1 + 1;
        uVar3 = uVar3 - 1;
      }
      toFill[uVar2] = '\0';
      return;
    }
    uStack_a0 = 0x265ffb;
    this = (RuntimeException *)__cxa_allocate_exception(0x30);
    uStack_a0 = 0x266018;
    IllegalArgumentException::IllegalArgumentException
              ((IllegalArgumentException *)this,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLString.cpp"
               ,0xa2,Str_TargetBufTooSmall,manager);
  }
  ppuVar4 = &IllegalArgumentException::typeinfo;
LAB_0026601f:
  uStack_a0 = 0x26602e;
  __cxa_throw(this,ppuVar4,XMLException::~XMLException);
}

Assistant:

void XMLString::sizeToText(  const  XMLSize_t           toFormat
                            ,       char* const          toFill
                            , const XMLSize_t            maxChars
                            , const unsigned int         radix
                            , MemoryManager* const       manager)
{
    static const char digitList[16] =
    {
          '0', '1', '2', '3', '4', '5', '6', '7', '8', '9'
        , 'A', 'B', 'C', 'D', 'E', 'F'
    };

    if (!maxChars)
        ThrowXMLwithMemMgr(IllegalArgumentException, XMLExcepts::Str_ZeroSizedTargetBuf, manager);

    // Handle special case
    if (!toFormat)
    {
        toFill[0] = '0';
        toFill[1] = 0;
        return;
    }

    // This is used to fill the temp buffer
    XMLSize_t tmpIndex = 0;

    // A copy of the conversion value that we can modify
    XMLSize_t tmpVal = toFormat;

    //
    //  Convert into a temp buffer that we know is large enough. This avoids
    //  having to check for overflow in the inner loops, and we have to flip
    //  the resulting XMLString anyway.
    //
    char   tmpBuf[128];

    //
    //  For each radix, do the optimal thing. For bin and hex, we can special
    //  case them and do shift and mask oriented stuff. For oct and decimal
    //  there isn't much to do but bull through it with divides.
    //
    if (radix == 2)
    {
        while (tmpVal)
        {
            if (tmpVal & 0x1UL)
                tmpBuf[tmpIndex++] = '1';
            else
                tmpBuf[tmpIndex++] = '0';
            tmpVal >>= 1;
        }
    }
     else if (radix == 16)
    {
        while (tmpVal)
        {
            const XMLSize_t charInd = (tmpVal & 0xFUL);
            tmpBuf[tmpIndex++] = digitList[charInd];
            tmpVal >>= 4;
        }
    }
     else if ((radix == 8) || (radix == 10))
    {
        while (tmpVal)
        {
            const XMLSize_t charInd = (tmpVal % radix);
            tmpBuf[tmpIndex++] = digitList[charInd];
            tmpVal /= radix;
        }
    }
    else
    {
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Str_UnknownRadix, manager);
    }

    // See if have enough room in the caller's buffer
    if (tmpIndex > maxChars)
    {
        ThrowXMLwithMemMgr(IllegalArgumentException, XMLExcepts::Str_TargetBufTooSmall, manager);
    }

    // Reverse the tmp buffer into the caller's buffer
    XMLSize_t outIndex = 0;
    for (; tmpIndex > 0; tmpIndex--)
        toFill[outIndex++] = tmpBuf[tmpIndex-1];

    // And cap off the caller's buffer
    toFill[outIndex] = char(0);
}